

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackDebGenerator::PackageOnePack
          (cmCPackDebGenerator *this,string *initialTopLevel,string *packageName)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined4 extraout_var;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  ostream *poVar5;
  uint uVar6;
  allocator local_2a9;
  string findExpr;
  string component_path;
  string packageFileName;
  char *local_248 [4];
  Glob gl;
  string outputFileName;
  string localToplevel;
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::string::string((string *)&localToplevel,(string *)initialTopLevel);
  cmsys::SystemTools::GetParentDirectory(&packageFileName,&(this->super_cmCPackGenerator).toplevel);
  std::__cxx11::string::string((string *)&findExpr,"CPACK_PACKAGE_FILE_NAME",(allocator *)local_248)
  ;
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&findExpr);
  std::__cxx11::string::string((string *)&component_path,pcVar4,&local_2a9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl,
                 &component_path,"-");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl,
                 packageName);
  iVar3 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])(this);
  std::operator+(&outputFileName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,(char *)CONCAT44(extraout_var,iVar3));
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::string::~string((string *)&component_path);
  std::__cxx11::string::~string((string *)&findExpr);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,"/",packageName);
  std::__cxx11::string::append((string *)&localToplevel);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_DIRECTORY",(allocator *)&gl);
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,localToplevel._M_dataplus._M_p)
  ;
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,"/",&outputFileName);
  std::__cxx11::string::append((string *)&packageFileName);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string((string *)&cmCPackLog_msg,"CPACK_OUTPUT_FILE_NAME",(allocator *)&gl);
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,outputFileName._M_dataplus._M_p
            );
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",(allocator *)&gl);
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,
             packageFileName._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_DEB_PACKAGE_COMPONENT",(allocator *)&gl);
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,(packageName->_M_dataplus)._M_p
            );
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string((string *)&component_path,"/",(allocator *)&cmCPackLog_msg);
  std::__cxx11::string::append((string *)&component_path);
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_DEB_PACKAGE_COMPONENT_PART_PATH",(allocator *)&gl);
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,component_path._M_dataplus._M_p
            );
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  bVar2 = cmCPackGenerator::ReadListFile(&this->super_cmCPackGenerator,"CPackDeb.cmake");
  if (bVar2) {
    cmsys::Glob::Glob(&gl);
    std::__cxx11::string::string((string *)&cmCPackLog_msg,"GEN_WDIR",(allocator *)local_248);
    pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::string((string *)&findExpr,pcVar4,&local_2a9);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::append((char *)&findExpr);
    gl.Recurse = true;
    gl.RecurseListDirs = true;
    bVar2 = cmsys::Glob::FindFiles(&gl,&findExpr,(GlobMessages *)0x0);
    if (bVar2) {
      __x = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->packageFiles,__x);
      iVar3 = createDeb(this);
      std::__cxx11::string::string
                ((string *)&cmCPackLog_msg,"CPACK_TOPLEVEL_DIRECTORY",(allocator *)local_248);
      cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
      std::__cxx11::string::assign((char *)&packageFileName);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::string::append((char *)&packageFileName);
      std::__cxx11::string::string
                ((string *)&cmCPackLog_msg,"GEN_CPACK_OUTPUT_FILE_NAME",(allocator *)local_248);
      cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
      std::__cxx11::string::append((char *)&packageFileName);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->super_cmCPackGenerator).packageFileNames,&packageFileName);
      uVar6 = (uint)(iVar3 == 1);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,
                               "Cannot find any files in the installed directory");
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x5b,local_248[0]);
      std::__cxx11::string::~string((string *)local_248);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      uVar6 = 0;
    }
    std::__cxx11::string::~string((string *)&findExpr);
    cmsys::Glob::~Glob(&gl);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Error while execution CPackDeb.cmake");
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x4e,(char *)gl.Internals);
    std::__cxx11::string::~string((string *)&gl);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    uVar6 = 0;
  }
  std::__cxx11::string::~string((string *)&component_path);
  std::__cxx11::string::~string((string *)&outputFileName);
  std::__cxx11::string::~string((string *)&packageFileName);
  std::__cxx11::string::~string((string *)&localToplevel);
  return uVar6;
}

Assistant:

int cmCPackDebGenerator::PackageOnePack(std::string const& initialTopLevel,
                                        std::string const& packageName)
{
  int retval = 1;
  // Begin the archive for this pack
  std::string localToplevel(initialTopLevel);
  std::string packageFileName(cmSystemTools::GetParentDirectory(toplevel));
  std::string outputFileName(
    std::string(this->GetOption("CPACK_PACKAGE_FILE_NAME")) + "-" +
    packageName + this->GetOutputExtension());

  localToplevel += "/" + packageName;
  /* replace the TEMP DIRECTORY with the component one */
  this->SetOption("CPACK_TEMPORARY_DIRECTORY", localToplevel.c_str());
  packageFileName += "/" + outputFileName;
  /* replace proposed CPACK_OUTPUT_FILE_NAME */
  this->SetOption("CPACK_OUTPUT_FILE_NAME", outputFileName.c_str());
  /* replace the TEMPORARY package file name */
  this->SetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME",
                  packageFileName.c_str());
  // Tell CPackDeb.cmake the name of the component GROUP.
  this->SetOption("CPACK_DEB_PACKAGE_COMPONENT", packageName.c_str());
  // Tell CPackDeb.cmake the path where the component is.
  std::string component_path = "/";
  component_path += packageName;
  this->SetOption("CPACK_DEB_PACKAGE_COMPONENT_PART_PATH",
                  component_path.c_str());
  if (!this->ReadListFile("CPackDeb.cmake")) {
    cmCPackLogger(cmCPackLog::LOG_ERROR, "Error while execution CPackDeb.cmake"
                    << std::endl);
    retval = 0;
    return retval;
  }

  cmsys::Glob gl;
  std::string findExpr(this->GetOption("GEN_WDIR"));
  findExpr += "/*";
  gl.RecurseOn();
  gl.SetRecurseListDirs(true);
  if (!gl.FindFiles(findExpr)) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot find any files in the installed directory"
                    << std::endl);
    return 0;
  }
  packageFiles = gl.GetFiles();

  int res = createDeb();
  if (res != 1) {
    retval = 0;
  }
  // add the generated package to package file names list
  packageFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  packageFileName += "/";
  packageFileName += this->GetOption("GEN_CPACK_OUTPUT_FILE_NAME");
  packageFileNames.push_back(packageFileName);
  return retval;
}